

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testdemon.cpp
# Opt level: O2

void my_slot_demon(void)

{
  uint uVar1;
  Am_Value *pAVar2;
  ostream *poVar3;
  Am_Object_Advanced self;
  Am_Slot slot_local;
  
  Am_Slot::Get_Owner();
  pAVar2 = (Am_Value *)Am_Object::Get((ushort)&self,0x65);
  uVar1 = Am_Value::operator_cast_to_int(pAVar2);
  Am_Object::Set((ushort)&self,(uint)MY_SLOT,(ulong)uVar1);
  poVar3 = std::operator<<((ostream *)&std::cerr,"demon activated at ");
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,uVar1);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::ostream::flush();
  poVar3 = std::operator<<((ostream *)&std::cerr,"Network contains ");
  pAVar2 = (Am_Value *)Am_Object::Get(0x5238,(ulong)MY_SLOT);
  poVar3 = (ostream *)operator<<(poVar3,pAVar2);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::ostream::flush();
  Am_Object::~Am_Object(&self.super_Am_Object);
  return;
}

Assistant:

void
my_slot_demon(Am_Slot slot)

{

  Am_Object_Advanced self = slot.Get_Owner();
  int top;
  top = self.Get(Am_TOP);
  self.Set(MY_SLOT, top);

  cerr << "demon activated at " << top << endl << flush;
  cerr << "Network contains " << Foo.Peek(MY_SLOT) << endl << flush;
}